

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonLibTests_RoundTrip.c
# Opt level: O1

WJTL_STATUS TestMarshallUnmarshall(void)

{
  bool bVar1;
  _Bool _Var2;
  JL_STATUS JVar3;
  JL_STATUS JVar4;
  JL_STATUS JVar5;
  JL_STATUS JVar6;
  JL_STATUS JVar7;
  WJTL_STATUS WVar8;
  byte bVar9;
  bool Condition;
  char *jsonString;
  StructType newStruct;
  StructType theStruct;
  JlMarshallElement marshalSubStructType [18];
  char *local_c88;
  JL_STATUS local_c80;
  uint local_c7c;
  JlMarshallElement local_c78;
  undefined4 local_c18;
  char *local_c10;
  undefined1 local_c08;
  undefined8 local_c00;
  undefined8 local_bf8;
  undefined8 local_bf0;
  undefined8 local_be8;
  undefined8 local_be0;
  undefined8 local_bd8;
  undefined4 local_bd0;
  undefined2 local_bcc;
  JlMarshallElement *local_bc8;
  undefined4 local_bc0;
  StructType local_bb8;
  StructType local_958;
  JlMarshallElement local_6f8 [18];
  
  memcpy(local_6f8,&DAT_00142730,0x6c0);
  local_c78.Type = JL_DATA_TYPE_DICTIONARY;
  local_c78.Name = "subStruct";
  WVar8 = WJTL_STATUS_SUCCESS;
  local_c78.IsArray = false;
  local_c78.FieldOffset = 0;
  local_c78.FieldSize = 0x78;
  local_c78.CountFieldOffset = 0;
  local_c78.CountFieldSize = 0;
  local_c78.ArrayFieldSize = 0;
  local_c78.ArrayItemSize._0_6_ = 0;
  local_c78.ArrayItemSize._6_2_ = 0;
  local_c78.NumberType = JL_NUM_TYPE_NONE;
  local_c78.IsHex = false;
  local_c78.IsBase64 = false;
  local_c78.ChildStructDescriptionCount = 0x12;
  local_c18 = 5;
  local_c10 = "subStructArray";
  local_c08 = 1;
  local_c00 = 0x78;
  local_bf8 = 0x1e0;
  local_bf0 = 600;
  local_be8 = 8;
  local_be0 = 0x1e0;
  local_bd8 = 0x78;
  local_bd0 = 0;
  local_bcc = 0;
  local_bc0 = 0x12;
  local_c78.ChildStructDescription = local_6f8;
  local_bc8 = local_6f8;
  memset(&local_958,0,0x260);
  local_958.subStruct.u8 = '\f';
  local_958.subStruct.u16 = 0x4d1;
  local_958.subStruct.u32 = 0x3404ccd;
  local_958.subStruct.u64 = 0xc46cceb3e8ccd;
  local_958.subStruct.s8 = '\x16';
  local_958.subStruct.s16 = -0x8b9;
  local_958.subStruct.s32 = -0x270392cd;
  local_958.subStruct.s64 = 0x1e0a46231f0ccd;
  local_958.subStruct.f32 = 100.5;
  local_958.subStruct.f64 = 21234.5;
  local_958.subStruct.hex32 = 0x12345678;
  local_958.subStruct.hex64 = 0x1122334455667788;
  local_958.subStruct.string = "This is a string to test";
  builtin_strncpy(local_958.subStruct.fixedString,"smallstr",9);
  local_958.subStruct.b1 = true;
  local_958.subStruct.b2 = false;
  builtin_memcpy(local_958.subStruct.fixedBin,"X123456",8);
  local_958.subStruct.varBin = "12345678901234567890";
  local_958.subStruct.varBinSize = 0x14;
  local_958.subStructArrayCount = 2;
  local_958.subStructArray[0].u8 = '\x11';
  local_958.subStructArray[0].u16 = 0x36e;
  local_958.subStructArray[0].u32 = 0x23c6a5;
  local_958.subStructArray[0].u64 = 0xf3ed3;
  local_958.subStructArray[0].s8 = -5;
  local_958.subStructArray[0].s16 = -0x21;
  local_958.subStructArray[0].s32 = -0x2f0f828d;
  local_958.subStructArray[0].s64 = 0x462d4b74a84cd;
  local_958.subStructArray[0].f32 = 200.5;
  local_958.subStructArray[0].f64 = 61234.5;
  local_958.subStructArray[0].hex32 = 0xa2345678;
  local_958.subStructArray[0].hex64 = 0xa122334455667788;
  local_958.subStructArray[0].string = "Also a string TEST";
  builtin_strncpy((char *)&local_958.subStructArray[0].u64,"tiny",5);
  local_958.subStructArray[0].b1 = true;
  local_958.subStructArray[0].b2 = false;
  builtin_memcpy(&local_958.subStructArray[0].u64,"ABCDEF",7);
  local_958.subStructArray[0].varBin = "AAAAAAAAAA";
  local_958.subStructArray[0].varBinSize = 10;
  local_958.subStructArray[1].u8 = 'W';
  local_958.subStructArray[1].u16 = 0x1dfe;
  local_958.subStructArray[1].u32 = 0x97be25;
  local_958.subStructArray[1].u64 = 0x3e76ff3;
  local_958.subStructArray[1].s8 = -9;
  local_958.subStructArray[1].s16 = -0x4d1;
  local_958.subStructArray[1].s32 = -0x265;
  local_958.subStructArray[1].s64 = -0x12d687;
  local_958.subStructArray[1].f32 = 40000.5;
  local_958.subStructArray[1].f64 = 6231234.5;
  local_958.subStructArray[1].hex32 = 0xb234b678;
  local_958.subStructArray[1].hex64 = 0xb12b33b45b66b788;
  local_958.subStructArray[1].string =
       "StringString STRING STRING \"String\"String \'String\' String // String";
  builtin_strncpy(local_958.subStructArray[1].fixedString,":-)",4);
  local_958.subStructArray[1].b1 = true;
  local_958.subStructArray[1].b2 = false;
  builtin_memcpy(local_958.subStructArray[1].fixedBin,"......",7);
  local_958.subStructArray[1].varBin = "abcdeabcdeabcdeabcdeabcdeabcde";
  local_958.subStructArray[1].varBinSize = 0x1e;
  local_c88 = (char *)0x0;
  JVar3 = JlStructToJsonEx(&local_958,&local_c78,2,2,&local_c88);
  WjTestLib_Assert(JVar3 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlStructToJsonEx( &theStruct, marshalStructType, ( sizeof(marshalStructType) / sizeof((marshalStructType)[0]) ), ((JL_OUTPUT_FLAGS) 0x2 ), &jsonString ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_RoundTrip.c"
                   ,"TestMarshallUnmarshall",0x1f8);
  local_c7c = (uint)(local_c88 != (char *)0x0);
  WjTestLib_Assert(local_c88 != (char *)0x0,"(jsonString) != NULL",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_RoundTrip.c"
                   ,"TestMarshallUnmarshall",0x1f9);
  memset(&local_bb8,0,0x260);
  local_c80 = JlJsonToStruct(local_c88,&local_c78,2,&local_bb8,(size_t *)0x0);
  WjTestLib_Assert(local_c80 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlJsonToStruct( jsonString, marshalStructType, ( sizeof(marshalStructType) / sizeof((marshalStructType)[0]) ), &newStruct, ((void*)0) ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_RoundTrip.c"
                   ,"TestMarshallUnmarshall",0x1fd);
  _Var2 = CompareStructType(&local_958,&local_bb8);
  WjTestLib_Assert(_Var2,"CompareStructType( &theStruct, &newStruct )",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_RoundTrip.c"
                   ,"TestMarshallUnmarshall",0x1fe);
  JVar4 = JlUnmarshallFreeStructAllocs(&local_c78,2,&local_bb8);
  WjTestLib_Assert(JVar4 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlUnmarshallFreeStructAllocs( marshalStructType, ( sizeof(marshalStructType) / sizeof((marshalStructType)[0]) ), &newStruct ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_RoundTrip.c"
                   ,"TestMarshallUnmarshall",0x200);
  WjTestLib_Free(local_c88);
  JVar5 = JlStructToJsonEx(&local_958,&local_c78,2,0x2e,&local_c88);
  WjTestLib_Assert(JVar5 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlStructToJsonEx( &theStruct, marshalStructType, ( sizeof(marshalStructType) / sizeof((marshalStructType)[0]) ), ( ((JL_OUTPUT_FLAGS) 0x4 ) | ((JL_OUTPUT_FLAGS) 0x8 ) | ((JL_OUTPUT_FLAGS) 0x20 ) ) | ((JL_OUTPUT_FLAGS) 0x2 ), &jsonString ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_RoundTrip.c"
                   ,"TestMarshallUnmarshall",0x205);
  bVar1 = local_c80 == JL_STATUS_SUCCESS;
  bVar9 = _Var2 & (byte)local_c7c;
  Condition = local_c88 != (char *)0x0;
  WjTestLib_Assert(Condition,"(jsonString) != NULL",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_RoundTrip.c"
                   ,"TestMarshallUnmarshall",0x206);
  memset(&local_bb8,0,0x260);
  JVar6 = JlJsonToStruct(local_c88,&local_c78,2,&local_bb8,(size_t *)0x0);
  WjTestLib_Assert(JVar6 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlJsonToStruct( jsonString, marshalStructType, ( sizeof(marshalStructType) / sizeof((marshalStructType)[0]) ), &newStruct, ((void*)0) ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_RoundTrip.c"
                   ,"TestMarshallUnmarshall",0x20a);
  _Var2 = CompareStructType(&local_958,&local_bb8);
  WjTestLib_Assert(_Var2,"CompareStructType( &theStruct, &newStruct )",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_RoundTrip.c"
                   ,"TestMarshallUnmarshall",0x20b);
  JVar7 = JlUnmarshallFreeStructAllocs(&local_c78,2,&local_bb8);
  WjTestLib_Assert(JVar7 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlUnmarshallFreeStructAllocs( marshalStructType, ( sizeof(marshalStructType) / sizeof((marshalStructType)[0]) ), &newStruct ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_RoundTrip.c"
                   ,"TestMarshallUnmarshall",0x20d);
  if ((Condition &
      bVar9 & (((JVar3 == JL_STATUS_SUCCESS && JVar4 == JL_STATUS_SUCCESS) && bVar1) &&
              JVar5 == JL_STATUS_SUCCESS)) == 0) {
    WVar8 = WJTL_STATUS_FAILED;
  }
  if (JVar7 != JL_STATUS_SUCCESS || JVar6 != JL_STATUS_SUCCESS) {
    WVar8 = WJTL_STATUS_FAILED;
  }
  if (!_Var2) {
    WVar8 = WJTL_STATUS_FAILED;
  }
  WjTestLib_Free(local_c88);
  return WVar8;
}

Assistant:

static
WJTL_STATUS
    TestMarshallUnmarshall
    (
        void
    )
{
    WJTL_STATUS TestReturn = WJTL_STATUS_SUCCESS;

    JlMarshallElement marshalSubStructType[] =
    {
        JlMarshallUnsigned( SubStructType, u64, "u64" ),
        JlMarshallUnsigned( SubStructType, u32, "u32" ),
        JlMarshallUnsigned( SubStructType, u16, "u16" ),
        JlMarshallUnsigned( SubStructType, u8, "u8" ),
        JlMarshallSigned( SubStructType, s64, "s64" ),
        JlMarshallSigned( SubStructType, s32, "s32" ),
        JlMarshallSigned( SubStructType, s16, "s16" ),
        JlMarshallSigned( SubStructType, s8, "s8" ),
        JlMarshallFloat( SubStructType, f32, "f32" ),
        JlMarshallFloat( SubStructType, f64, "f64" ),
        JlMarshallUnsignedHex( SubStructType, hex64, "hex64" ),
        JlMarshallUnsignedHex( SubStructType, hex32, "hex32" ),
        JlMarshallString( SubStructType, string, "string" ),
        JlMarshallStringFixed( SubStructType, fixedString, "fixedString" ),
        JlMarshallBool( SubStructType, b1, "b1" ),
        JlMarshallBool( SubStructType, b2, "b2" ),
        JlMarshallBinaryFixed( SubStructType, fixedBin, "fixedBin" ),
        JlMarshallBinary( SubStructType, varBin, varBinSize, "varBin" ),
    };

    JlMarshallElement marshalStructType[] =
    {
        JlMarshallStruct( StructType, subStruct, "subStruct", marshalSubStructType, NumElements(marshalSubStructType) ),
        JlMarshallStructFixedArray( StructType, subStructArray, subStructArrayCount, "subStructArray", SubStructType, marshalSubStructType, NumElements(marshalSubStructType) ),
    };

    // Create structure full of data
    StructType theStruct = {{0}};

    theStruct.subStruct.u8 = 12;
    theStruct.subStruct.u16 = 1233;
    theStruct.subStruct.u32 = 54545613;
    theStruct.subStruct.u64 = 3455545654545613;
    theStruct.subStruct.s8 = 22;
    theStruct.subStruct.s16 = -2233;
    theStruct.subStruct.s32 = -654545613;
    theStruct.subStruct.s64 = 8455545654545613;
    theStruct.subStruct.f32 = 100.5;
    theStruct.subStruct.f64 = 21234.5;
    theStruct.subStruct.hex32 = 0x12345678;
    theStruct.subStruct.hex64 = 0x1122334455667788ULL;
    theStruct.subStruct.string = "This is a string to test";
    strcpy( theStruct.subStruct.fixedString, "smallstr" );
    theStruct.subStruct.b1 = true;
    theStruct.subStruct.b2 = false;
    strcpy( (char*)theStruct.subStruct.fixedBin, "X123456" );
    theStruct.subStruct.varBin = (uint8_t*) "12345678901234567890";
    theStruct.subStruct.varBinSize = 20;

    theStruct.subStructArrayCount = 2;

    theStruct.subStructArray[0].u8 = 17;
    theStruct.subStructArray[0].u16 = 878;
    theStruct.subStructArray[0].u32 = 2344613;
    theStruct.subStructArray[0].u64 = 999123;
    theStruct.subStructArray[0].s8 = -5;
    theStruct.subStructArray[0].s16 = -33;
    theStruct.subStructArray[0].s32 = -789545613;
    theStruct.subStructArray[0].s64 = 1234565654545613;
    theStruct.subStructArray[0].f32 = 200.5;
    theStruct.subStructArray[0].f64 = 61234.5;
    theStruct.subStructArray[0].hex32 = 0xA2345678;
    theStruct.subStructArray[0].hex64 = 0xA122334455667788;
    theStruct.subStructArray[0].string = "Also a string TEST";
    strcpy( theStruct.subStructArray[0].fixedString, "tiny" );
    theStruct.subStructArray[0].b1 = true;
    theStruct.subStructArray[0].b2 = false;
    strcpy( (char*)theStruct.subStructArray[0].fixedBin, "ABCDEF" );
    theStruct.subStructArray[0].varBin = (uint8_t*) "AAAAAAAAAA";
    theStruct.subStructArray[0].varBinSize = 10;

    theStruct.subStructArray[1].u8 = 87;
    theStruct.subStructArray[1].u16 = 7678;
    theStruct.subStructArray[1].u32 = 9944613;
    theStruct.subStructArray[1].u64 = 65499123;
    theStruct.subStructArray[1].s8 = -9;
    theStruct.subStructArray[1].s16 = -1233;
    theStruct.subStructArray[1].s32 = -613;
    theStruct.subStructArray[1].s64 = -1234567;
    theStruct.subStructArray[1].f32 = 40000.5;
    theStruct.subStructArray[1].f64 = 6231234.5;
    theStruct.subStructArray[1].hex32 = 0xB234B678;
    theStruct.subStructArray[1].hex64 = 0xB12B33B45B66B788;
    theStruct.subStructArray[1].string = "StringString STRING STRING \"String\"String 'String' String // String";
    strcpy( theStruct.subStructArray[1].fixedString, ":-)" );
    theStruct.subStructArray[1].b1 = true;
    theStruct.subStructArray[1].b2 = false;
    strcpy( (char*)theStruct.subStructArray[1].fixedBin, "......" );
    theStruct.subStructArray[1].varBin = (uint8_t*) "abcdeabcdeabcdeabcdeabcdeabcde";
    theStruct.subStructArray[1].varBinSize = 30;

    // Now marshall and unmarshall via json1 with indent formatting
    char* jsonString = NULL;
    JL_ASSERT_SUCCESS( JlStructToJsonEx(
        &theStruct, marshalStructType, NumElements(marshalStructType), JL_OUTPUT_FLAGS_INDENT, &jsonString ) );
    JL_ASSERT_NOT_NULL( jsonString );

    StructType newStruct = {{0}};
    JL_ASSERT_SUCCESS( JlJsonToStruct(
        jsonString, marshalStructType, NumElements(marshalStructType), &newStruct, NULL ) );
    JL_ASSERT( CompareStructType( &theStruct, &newStruct ) );

    JL_ASSERT_SUCCESS( JlUnmarshallFreeStructAllocs( marshalStructType, NumElements(marshalStructType), &newStruct ) );
    JlFree( jsonString );

    // Now marshall and unmarshall via json5 with indent formatting
    JL_ASSERT_SUCCESS( JlStructToJsonEx(
        &theStruct, marshalStructType, NumElements(marshalStructType), JL_OUTPUT_FLAGS_JSON5 | JL_OUTPUT_FLAGS_INDENT, &jsonString ) );
    JL_ASSERT_NOT_NULL( jsonString );

    memset( &newStruct, 0, sizeof(newStruct) );
    JL_ASSERT_SUCCESS( JlJsonToStruct(
        jsonString, marshalStructType, NumElements(marshalStructType), &newStruct, NULL ) );
    JL_ASSERT( CompareStructType( &theStruct, &newStruct ) );

    JL_ASSERT_SUCCESS( JlUnmarshallFreeStructAllocs( marshalStructType, NumElements(marshalStructType), &newStruct ) );
    JlFree( jsonString );

    return TestReturn;
}